

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O0

base_uint<256U> * __thiscall base_uint<256U>::operator*=(base_uint<256U> *this,base_uint<256U> *b)

{
  long in_RSI;
  base_uint<256U> *in_RDI;
  long in_FS_OFFSET;
  uint64_t n;
  int i;
  uint64_t carry;
  int j;
  base_uint<256U> a;
  base_uint<256U> *in_stack_ffffffffffffffa8;
  int local_4c;
  ulong local_48;
  int local_3c;
  uint local_28 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  base_uint(in_stack_ffffffffffffffa8);
  for (local_3c = 0; local_3c < 8; local_3c = local_3c + 1) {
    local_48 = 0;
    for (local_4c = 0; local_4c + local_3c < 8; local_4c = local_4c + 1) {
      in_stack_ffffffffffffffa8 =
           (base_uint<256U> *)
           (local_48 + local_28[local_4c + local_3c] +
           (ulong)in_RDI->pn[local_3c] * (ulong)*(uint *)(in_RSI + (long)local_4c * 4));
      local_28[local_4c + local_3c] = (uint)in_stack_ffffffffffffffa8;
      local_48 = (ulong)in_stack_ffffffffffffffa8 >> 0x20;
    }
  }
  operator=(in_stack_ffffffffffffffa8,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

base_uint<BITS>& base_uint<BITS>::operator*=(const base_uint& b)
{
    base_uint<BITS> a;
    for (int j = 0; j < WIDTH; j++) {
        uint64_t carry = 0;
        for (int i = 0; i + j < WIDTH; i++) {
            uint64_t n = carry + a.pn[i + j] + (uint64_t)pn[j] * b.pn[i];
            a.pn[i + j] = n & 0xffffffff;
            carry = n >> 32;
        }
    }
    *this = a;
    return *this;
}